

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

void __thiscall cppforth::Forth::writeLine(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  uint uVar3;
  uint src;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string fileData;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48;
  
  requireDStackDepth(this,3,"WRITE-LINE");
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"WRITE-LINE","");
  GetFileHandle((Forth *)&local_58,(Cell)this,(string *)(ulong)uVar3,(errorCodes)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  moveFromDataSpace(this,&local_48,src,(ulong)uVar3);
  std::ios::clear((int)local_58 + (int)*(undefined8 *)(*local_58 + -0x18));
  std::ostream::write((char *)(local_58 + 2),(long)local_48._M_dataplus._M_p);
  cVar2 = (char)local_58 + '\x10';
  std::ios::widen((char)*(undefined8 *)(local_58[2] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  ForthStack<unsigned_int>::setTop
            (this_00,-(*(uint *)((long)local_58 + *(long *)(*local_58 + -0x18) + 0x20) & 1) &
                     0xffffffb4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void writeLine() {
	REQUIRE_DSTACK_DEPTH(3, "WRITE-LINE");
	auto h = (dStack.getTop()); pop();
	auto f = GetFileHandle(h, "WRITE-LINE", errorWriteLine);
	auto length = SIZE_T(dStack.getTop()); pop();
	auto caddr = (dStack.getTop());
	std::string fileData{};
	moveFromDataSpace(fileData, caddr, length);
	f->clear();
	f->write(fileData.c_str(), static_cast<std::streamsize>(length));
	(*f) << std::endl;
	auto status = f->rdstate();
	auto written = f->gcount();
	Cell ior = f->bad() ? Cell(errorWriteLine) : 0;
	dStack.setTop(ior);
}